

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

bool CaDiCaL::parse_int_str(char *val_str,int *val)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  char cVar7;
  char *pcVar8;
  bool bVar9;
  
  iVar2 = strcmp(val_str,"true");
  if (iVar2 == 0) {
    iVar2 = 1;
  }
  else {
    iVar2 = strcmp(val_str,"false");
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      uVar3 = (ulong)(*val_str == '-');
      if (9 < (int)val_str[uVar3] - 0x30U) {
        return false;
      }
      uVar4 = (ulong)((int)val_str[uVar3] - 0x30U);
      cVar7 = val_str[uVar3 + 1];
      pcVar8 = val_str + uVar3 + 2;
      while (uVar1 = (int)cVar7 - 0x30, uVar1 < 10) {
        lVar6 = uVar4 * 10;
        if (0xccccccc < (long)uVar4) {
          lVar6 = 0x80000000;
        }
        uVar4 = (ulong)uVar1 + lVar6;
        if ((long)(0x80000000 - (ulong)uVar1) < lVar6) {
          uVar4 = 0x80000000;
        }
        cVar7 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      }
      if (cVar7 != '\0') {
        if (cVar7 != 'e') {
          return false;
        }
        cVar7 = *pcVar8;
        uVar1 = (int)cVar7 - 0x30;
        if (uVar1 < 10) {
          uVar5 = 0;
          do {
            pcVar8 = pcVar8 + 1;
            bVar9 = uVar5 != 0;
            uVar5 = uVar1;
            if (bVar9) {
              uVar5 = 10;
            }
            cVar7 = *pcVar8;
            uVar1 = (int)cVar7 - 0x30;
          } while (uVar1 < 10);
        }
        else {
          uVar5 = 0;
        }
        if (cVar7 != '\0') {
          return false;
        }
        for (; uVar5 != 0; uVar5 = uVar5 - 1) {
          uVar4 = uVar4 * 10;
        }
      }
      if (*val_str == '-') {
        lVar6 = -0x80000000;
        if (-0x80000000 < (long)-uVar4) {
          lVar6 = -uVar4;
        }
        iVar2 = (int)lVar6;
      }
      else {
        uVar3 = 0x7fffffff;
        if ((long)uVar4 < 0x7fffffff) {
          uVar3 = uVar4;
        }
        iVar2 = (int)uVar3;
      }
    }
  }
  *val = iVar2;
  return true;
}

Assistant:

bool parse_int_str (const char *val_str, int &val) {
  if (!strcmp (val_str, "true"))
    val = 1;
  else if (!strcmp (val_str, "false"))
    val = 0;
  else {
    const char *p = val_str;
    int sign;

    if (*p == '-')
      sign = -1, p++;
    else
      sign = 1;

    int ch;
    if (!isdigit ((ch = *p++)))
      return false;

    const int64_t bound = -(int64_t) INT_MIN;
    int64_t mantissa = ch - '0';

    while (isdigit (ch = *p++)) {
      if (bound / 10 < mantissa)
        mantissa = bound;
      else
        mantissa *= 10;
      const int digit = ch - '0';
      if (bound - digit < mantissa)
        mantissa = bound;
      else
        mantissa += digit;
    }

    int exponent = 0;
    if (ch == 'e') {
      while (isdigit ((ch = *p++)))
        exponent = exponent ? 10 : ch - '0';
      if (ch)
        return false;
    } else if (ch)
      return false;

    assert (exponent <= 10);
    int64_t val64 = mantissa;
    for (int i = 0; i < exponent; i++)
      val64 *= 10;

    if (sign < 0) {
      val64 = -val64;
      if (val64 < INT_MIN)
        val64 = INT_MIN;
    } else {
      if (val64 > INT_MAX)
        val64 = INT_MAX;
    }

    assert (INT_MIN <= val64);
    assert (val64 <= INT_MAX);

    val = val64;
  }
  return true;
}